

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.cpp
# Opt level: O3

void __thiscall phyr::AccelBVH::constructBVH(AccelBVH *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  double *pdVar2;
  pointer psVar3;
  undefined1 auVar4 [16];
  double dVar5;
  pointer psVar6;
  pointer psVar7;
  BVHTreeNode *treeNode;
  LinearBVHNode *pLVar8;
  long lVar9;
  size_type __n;
  long lVar10;
  long lVar11;
  int nodeCount;
  int linearIdx;
  vector<phyr::BVHObjectInfo,_std::allocator<phyr::BVHObjectInfo>_> objectInfoList;
  MemoryPool pool;
  int local_178 [2];
  string local_170;
  double local_150;
  double dStack_148;
  vector<std::shared_ptr<phyr::Object>,_std::allocator<std::shared_ptr<phyr::Object>_>_> local_140;
  size_type local_120;
  vector<phyr::BVHObjectInfo,_std::allocator<phyr::BVHObjectInfo>_> local_118;
  MemoryPool local_100;
  
  lVar9 = (long)(this->objectList).
                super__Vector_base<std::shared_ptr<phyr::Object>,_std::allocator<std::shared_ptr<phyr::Object>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->objectList).
                super__Vector_base<std::shared_ptr<phyr::Object>,_std::allocator<std::shared_ptr<phyr::Object>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar9 != 0) {
    __n = lVar9 >> 4;
    std::vector<phyr::BVHObjectInfo,_std::allocator<phyr::BVHObjectInfo>_>::vector
              (&local_118,__n,(allocator_type *)&local_100);
    lVar10 = 0;
    lVar11 = 0;
    lVar9 = 0;
    local_120 = __n;
    do {
      (**(code **)(**(long **)((long)&(((this->objectList).
                                        super__Vector_base<std::shared_ptr<phyr::Object>,_std::allocator<std::shared_ptr<phyr::Object>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->
                                      super___shared_ptr<phyr::Object,_(__gnu_cxx::_Lock_policy)2>).
                                      _M_ptr + lVar11) + 0x10))(&local_170);
      *(long *)((long)&(local_118.
                        super__Vector_base<phyr::BVHObjectInfo,_std::allocator<phyr::BVHObjectInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start)->objectIdx + lVar10) = lVar9;
      dVar5 = local_150 * 0.5 + (double)local_170._M_string_length * 0.5;
      pdVar2 = (double *)
               ((long)&((local_118.
                         super__Vector_base<phyr::BVHObjectInfo,_std::allocator<phyr::BVHObjectInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start)->bounds).pMax.y + lVar10);
      *pdVar2 = local_150;
      pdVar2[1] = dStack_148;
      pdVar2 = (double *)
               ((long)&((local_118.
                         super__Vector_base<phyr::BVHObjectInfo,_std::allocator<phyr::BVHObjectInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start)->bounds).pMin.z + lVar10);
      *pdVar2 = (double)local_170.field_2._M_allocated_capacity;
      pdVar2[1] = (double)local_170.field_2._8_8_;
      pdVar2 = (double *)
               ((long)&((local_118.
                         super__Vector_base<phyr::BVHObjectInfo,_std::allocator<phyr::BVHObjectInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start)->bounds).pMin.x + lVar10);
      *pdVar2 = (double)local_170._M_dataplus._M_p;
      pdVar2[1] = (double)local_170._M_string_length;
      auVar4._8_4_ = SUB84(dVar5,0);
      auVar4._0_8_ = (double)local_170.field_2._8_8_ * 0.5 +
                     (double)local_170._M_dataplus._M_p * 0.5;
      auVar4._12_4_ = (int)((ulong)dVar5 >> 0x20);
      *(undefined1 (*) [16])
       ((long)&((local_118.
                 super__Vector_base<phyr::BVHObjectInfo,_std::allocator<phyr::BVHObjectInfo>_>.
                 _M_impl.super__Vector_impl_data._M_start)->centroid).x + lVar10) = auVar4;
      *(double *)
       ((long)&((local_118.
                 super__Vector_base<phyr::BVHObjectInfo,_std::allocator<phyr::BVHObjectInfo>_>.
                 _M_impl.super__Vector_impl_data._M_start)->centroid).z + lVar10) =
           dStack_148 * 0.5 + (double)local_170.field_2._M_allocated_capacity * 0.5;
      lVar9 = lVar9 + 1;
      lVar11 = lVar11 + 0x10;
      lVar10 = lVar10 + 0x50;
    } while (__n + (__n == 0) != lVar9);
    local_178[0] = 0;
    local_100.freeBlocks.
    super__List_base<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_100.freeBlocks;
    local_100.blockSize = 0x100000;
    local_100.totalAllocSize = 0;
    local_100.curBlockOffset = 0;
    local_100.curAllocSize = 0;
    local_100.blockPtr = (uint8_t *)0x0;
    local_100.freeBlocks.
    super__List_base<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
    ._M_impl._M_node._M_size = 0;
    local_100.usedBlocks.
    super__List_base<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_100.usedBlocks;
    local_100.usedBlocks.
    super__List_base<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
    ._M_impl._M_node._M_size = 0;
    local_140.
    super__Vector_base<std::shared_ptr<phyr::Object>,_std::allocator<std::shared_ptr<phyr::Object>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_140.
    super__Vector_base<std::shared_ptr<phyr::Object>,_std::allocator<std::shared_ptr<phyr::Object>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_140.
    super__Vector_base<std::shared_ptr<phyr::Object>,_std::allocator<std::shared_ptr<phyr::Object>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_100.freeBlocks.
    super__List_base<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev =
         local_100.freeBlocks.
         super__List_base<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
         ._M_impl._M_node.super__List_node_base._M_next;
    local_100.usedBlocks.
    super__List_base<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev =
         local_100.usedBlocks.
         super__List_base<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
         ._M_impl._M_node.super__List_node_base._M_next;
    formatString<char_const*,int>
              (&local_170,"[%s] \x1b[37;1mINFO(%d):\x1b[0m Computing BVH tree...\n",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/methusael13[P]phy-ray/phyray_lib/src/core/accel/bvh.cpp"
               ,0x1e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,local_170._M_dataplus._M_p,local_170._M_string_length);
    paVar1 = &local_170.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != paVar1) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    treeNode = constructBVHRecursive
                         (this,&local_100,&local_118,0,(int)local_120,local_178,&local_140);
    psVar3 = (this->objectList).
             super__Vector_base<std::shared_ptr<phyr::Object>,_std::allocator<std::shared_ptr<phyr::Object>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->objectList).
    super__Vector_base<std::shared_ptr<phyr::Object>,_std::allocator<std::shared_ptr<phyr::Object>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_140.
         super__Vector_base<std::shared_ptr<phyr::Object>,_std::allocator<std::shared_ptr<phyr::Object>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    psVar6 = (this->objectList).
             super__Vector_base<std::shared_ptr<phyr::Object>,_std::allocator<std::shared_ptr<phyr::Object>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar7 = (this->objectList).
             super__Vector_base<std::shared_ptr<phyr::Object>,_std::allocator<std::shared_ptr<phyr::Object>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    (this->objectList).
    super__Vector_base<std::shared_ptr<phyr::Object>,_std::allocator<std::shared_ptr<phyr::Object>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_140.
         super__Vector_base<std::shared_ptr<phyr::Object>,_std::allocator<std::shared_ptr<phyr::Object>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (this->objectList).
    super__Vector_base<std::shared_ptr<phyr::Object>,_std::allocator<std::shared_ptr<phyr::Object>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_140.
         super__Vector_base<std::shared_ptr<phyr::Object>,_std::allocator<std::shared_ptr<phyr::Object>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_140.
    super__Vector_base<std::shared_ptr<phyr::Object>,_std::allocator<std::shared_ptr<phyr::Object>_>_>
    ._M_impl.super__Vector_impl_data._M_start = psVar6;
    local_140.
    super__Vector_base<std::shared_ptr<phyr::Object>,_std::allocator<std::shared_ptr<phyr::Object>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = psVar7;
    local_140.
    super__Vector_base<std::shared_ptr<phyr::Object>,_std::allocator<std::shared_ptr<phyr::Object>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = psVar3;
    formatString<char_const*,int,int>
              (&local_170,"[%s] \x1b[37;1mINFO(%d):\x1b[0m Computed BVH nodes: %d\n",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/methusael13[P]phy-ray/phyray_lib/src/core/accel/bvh.cpp"
               ,0x22,local_178[0]);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,local_170._M_dataplus._M_p,local_170._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != paVar1) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    local_178[1] = 0;
    pLVar8 = (LinearBVHNode *)allocAligned((long)local_178[0] * 0x38);
    this->bvhNodes = pLVar8;
    if (0 < (long)local_178[0]) {
      lVar9 = 0;
      do {
        *(undefined8 *)(pLVar8->_padding + lVar9 + -0x37) = 0xffefffffffffffff;
        *(undefined8 *)(pLVar8->_padding + lVar9 + -0x37 + 8) = 0xffefffffffffffff;
        *(undefined8 *)(pLVar8->_padding + lVar9 + -0x27) = 0xffefffffffffffff;
        *(undefined8 *)(pLVar8->_padding + lVar9 + -0x27 + 8) = 0x7fefffffffffffff;
        *(undefined8 *)(pLVar8->_padding + lVar9 + -0x17) = 0x7fefffffffffffff;
        *(undefined8 *)(pLVar8->_padding + lVar9 + -0x17 + 8) = 0x7fefffffffffffff;
        lVar9 = lVar9 + 0x38;
      } while ((long)local_178[0] * 0x38 - lVar9 != 0);
    }
    formatString<char_const*,int>
              (&local_170,"[%s] \x1b[37;1mINFO(%d):\x1b[0m Flattening BVH nodes...\n",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/methusael13[P]phy-ray/phyray_lib/src/core/accel/bvh.cpp"
               ,0x2c);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,local_170._M_dataplus._M_p,local_170._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != paVar1) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    flattenBVH(this,treeNode,local_178 + 1);
    std::vector<std::shared_ptr<phyr::Object>,_std::allocator<std::shared_ptr<phyr::Object>_>_>::
    ~vector(&local_140);
    MemoryPool::~MemoryPool(&local_100);
    if (local_118.super__Vector_base<phyr::BVHObjectInfo,_std::allocator<phyr::BVHObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_118.
                      super__Vector_base<phyr::BVHObjectInfo,_std::allocator<phyr::BVHObjectInfo>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void AccelBVH::constructBVH() {
    if (objectList.size() == 0) return;

    // Initiate object info list
    size_t sz = objectList.size();
    std::vector<BVHObjectInfo> objectInfoList(sz);

    for (size_t i = 0; i < sz; i++)
        objectInfoList[i] = { i, objectList[i]->worldBounds() };

    // Create a BVH Tree from the object info list
    int nodeCount = 0;
    // Memory pool with a block size of 1MB
    MemoryPool pool(1024 * 1024);
    // Stores the ordered permutation of objectList as defined
    // by the recursive BVH algorithm
    std::vector<std::shared_ptr<Object>> orderedObjectList;

    // Recursively build the BVH Tree
    LOG_INFO("Computing BVH tree...");
    BVHTreeNode* root = constructBVHRecursive(pool, objectInfoList, 0, sz,
                                              &nodeCount, orderedObjectList);
    objectList.swap(orderedObjectList);
    LOG_INFO_FMT("Computed BVH nodes: %d", nodeCount);

    // Compute linear BVH by DFS on {root}
    int linearIdx = 0;
    bvhNodes = allocAligned<LinearBVHNode>(nodeCount);
    // Initilize components in {LinearBVHNode}
    for (int i = 0; i < nodeCount; i++)
        new (&bvhNodes[i]) LinearBVHNode();

    // Transform BVH tree to a BVH linear array
    LOG_INFO("Flattening BVH nodes...");
    flattenBVH(root, &linearIdx);
    ASSERT(linearIdx == nodeCount);
}